

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O1

DecodeStatus DecodeBaseAddSubImm(MCInst *Inst,uint32_t insn,uint64_t Addr,void *Decoder)

{
  DecodeStatus DVar1;
  uint Reg;
  uint Reg_00;
  uint uVar2;
  uint *puVar3;
  uint uVar4;
  
  uVar4 = insn >> 0x16 & 3;
  DVar1 = MCDisassembler_Fail;
  if (uVar4 < 2) {
    uVar2 = insn >> 5 & 0x1f;
    puVar3 = GPR64DecoderTable;
    if (-1 < (int)insn) {
      puVar3 = GPR32DecoderTable;
    }
    Reg_00 = -1 < (int)insn | 4;
    Reg = Reg_00;
    if ((insn & 0x2000001f) != 0x1f) {
      Reg = puVar3[insn & 0x1f];
    }
    MCOperand_CreateReg0(Inst,Reg);
    if (uVar2 != 0x1f) {
      Reg_00 = puVar3[uVar2];
    }
    MCOperand_CreateReg0(Inst,Reg_00);
    MCOperand_CreateImm0(Inst,(ulong)(insn >> 10 & 0xfff));
    MCOperand_CreateImm0(Inst,(ulong)(uVar4 * 0xc));
    DVar1 = MCDisassembler_Success;
  }
  return DVar1;
}

Assistant:

static DecodeStatus DecodeBaseAddSubImm(MCInst *Inst, uint32_t insn,
		uint64_t Addr, void *Decoder)
{
	unsigned Rd = fieldFromInstruction(insn, 0, 5);
	unsigned Rn = fieldFromInstruction(insn, 5, 5);
	unsigned Imm = fieldFromInstruction(insn, 10, 14);
	unsigned S = fieldFromInstruction(insn, 29, 1);
	unsigned Datasize = fieldFromInstruction(insn, 31, 1);

	unsigned ShifterVal = (Imm >> 12) & 3;
	unsigned ImmVal = Imm & 0xFFF;

	if (ShifterVal != 0 && ShifterVal != 1)
		return Fail;

	if (Datasize) {
		if (Rd == 31 && !S)
			DecodeGPR64spRegisterClass(Inst, Rd, Addr, Decoder);
		else
			DecodeGPR64RegisterClass(Inst, Rd, Addr, Decoder);
		DecodeGPR64spRegisterClass(Inst, Rn, Addr, Decoder);
	} else {
		if (Rd == 31 && !S)
			DecodeGPR32spRegisterClass(Inst, Rd, Addr, Decoder);
		else
			DecodeGPR32RegisterClass(Inst, Rd, Addr, Decoder);
		DecodeGPR32spRegisterClass(Inst, Rn, Addr, Decoder);
	}

	//if (!Dis->tryAddingSymbolicOperand(Inst, Imm, Addr, Fail, 0, 4))
	MCOperand_CreateImm0(Inst, ImmVal);
	MCOperand_CreateImm0(Inst, 12 * ShifterVal);
	return Success;
}